

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# version_set.cc
# Opt level: O2

Iterator * leveldb::GetFileIterator(void *arg,ReadOptions *options,Slice *file_value)

{
  uint8_t *buffer;
  Iterator *pIVar1;
  Status SStack_38;
  Slice local_30;
  Slice local_20;
  
  if (file_value->size_ == 0x10) {
    pIVar1 = TableCache::NewIterator
                       ((TableCache *)arg,options,*(uint64_t *)file_value->data_,
                        *(uint64_t *)((long)file_value->data_ + 8),(Table **)0x0);
    return pIVar1;
  }
  local_20.data_ = "FileReader invoked with unexpected value";
  local_20.size_ = 0x28;
  local_30.data_ = "";
  local_30.size_ = 0;
  Status::Corruption(&SStack_38,&local_20,&local_30);
  pIVar1 = NewErrorIterator(&SStack_38);
  Status::~Status(&SStack_38);
  return pIVar1;
}

Assistant:

static Iterator* GetFileIterator(void* arg, const ReadOptions& options,
                                 const Slice& file_value) {
  TableCache* cache = reinterpret_cast<TableCache*>(arg);
  if (file_value.size() != 16) {
    return NewErrorIterator(
        Status::Corruption("FileReader invoked with unexpected value"));
  } else {
    return cache->NewIterator(options, DecodeFixed64(file_value.data()),
                              DecodeFixed64(file_value.data() + 8));
  }
}